

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

ostream * __thiscall GEO::Logger::err_stream(Logger *this,string *feature)

{
  bool bVar1;
  string *feature_local;
  Logger *this_local;
  
  if (((this->quiet_ & 1U) == 0) &&
     (bVar1 = std::operator!=(&this->current_feature_,feature), bVar1)) {
    this->current_feature_changed_ = true;
    std::__cxx11::string::operator=((string *)&this->current_feature_,(string *)feature);
  }
  return &(this->err_).super_ostream;
}

Assistant:

std::ostream& Logger::err_stream(const std::string& feature) {
        if(!quiet_ && current_feature_ != feature) {
            current_feature_changed_ = true;
            current_feature_ = feature;
        }
        return err_;
    }